

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O3

void __thiscall
ZXing::Result::Result
          (Result *this,string *text,int y,int xStart,int xStop,BarcodeFormat format,
          SymbologyIdentifier si,Error *error,bool readerInit)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pcVar1;
  PointT<int> PVar2;
  PointT<int> PVar3;
  allocator_type local_4d;
  BarcodeFormat local_4c;
  void *local_48 [2];
  long local_38;
  
  __first._M_current = (text->_M_dataplus)._M_p;
  local_4c = format;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + text->_M_string_length),&local_4d);
  Content::Content(&this->_content,(ByteArray *)local_48,si);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  (this->_error)._msg._M_dataplus._M_p = (pointer)&(this->_error)._msg.field_2;
  pcVar1 = (error->_msg)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_error,pcVar1,pcVar1 + (error->_msg)._M_string_length);
  *(undefined4 *)((long)&(this->_error)._file + 7) = *(undefined4 *)((long)&error->_file + 7);
  (this->_error)._file = error->_file;
  PVar2.y = y;
  PVar2.x = xStart;
  PVar3.y = y;
  PVar3.x = xStop;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar2;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] = PVar3;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = PVar3;
  (this->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PVar2;
  *(uint *)&this->_readerOpts = *(uint *)&this->_readerOpts & 0xc0e08000 | 0x80d2f;
  (this->_readerOpts)._minLineCount = '\x02';
  (this->_readerOpts)._maxNumberOfSymbols = 0xff;
  (this->_readerOpts)._downscaleThreshold = 500;
  (this->_readerOpts)._formats = 0;
  (this->_sai).index = -1;
  (this->_sai).count = -1;
  (this->_sai).id._M_dataplus._M_p = (pointer)&(this->_sai).id.field_2;
  (this->_sai).id._M_string_length = 0;
  (this->_sai).id.field_2._M_local_buf[0] = '\0';
  this->_format = local_4c;
  *(undefined8 *)(this->_version + 2) = 0;
  this->_ecLevel[0] = '\0';
  this->_ecLevel[1] = '\0';
  this->_ecLevel[2] = '\0';
  this->_ecLevel[3] = '\0';
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  this->_version[3] = '\0';
  this->_readerInit = readerInit;
  return;
}

Assistant:

Result::Result(const std::string& text, int y, int xStart, int xStop, BarcodeFormat format, SymbologyIdentifier si, Error error, bool readerInit)
	: _content({ByteArray(text)}, si),
	  _error(error),
	  _position(Line(y, xStart, xStop)),
	  _format(format),
	  _readerInit(readerInit)
{}